

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# makefile.cpp
# Opt level: O2

void __thiscall MakefileGenerator::writeExtraVariables(MakefileGenerator *this,QTextStream *t)

{
  QMakeProject *this_00;
  _List_node_base *p_Var1;
  char cVar2;
  ProStringList *pPVar3;
  ProString *pPVar4;
  _Rb_tree_node_base *p_Var5;
  long lVar6;
  QTextStream *pQVar7;
  _Rb_tree_node_base *p_Var8;
  ProString *this_01;
  long in_FS_OFFSET;
  QArrayDataPointer<char16_t> local_d8;
  QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[8],_const_ProKey_&>,_const_char_(&)[4]>,_QString>
  local_c0;
  QRegularExpression rx;
  ProString local_88;
  QArrayDataPointer<ProString> local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  Qt::endl(t);
  local_58.size = 0;
  local_58.d = (Data *)0x0;
  local_58.ptr = (ProString *)0x0;
  this_00 = this->project;
  p_Var1 = (this_00->super_QMakeEvaluator).m_valuemapStack.
           super_list<QMap<ProKey,_ProStringList>,_std::allocator<QMap<ProKey,_ProStringList>_>_>.
           super__List_base<QMap<ProKey,_ProStringList>,_std::allocator<QMap<ProKey,_ProStringList>_>_>
           ._M_impl._M_node.super__List_node_base._M_next;
  ProKey::ProKey((ProKey *)&local_88,"QMAKE_EXTRA_VARIABLES");
  pPVar3 = QMakeEvaluator::valuesRef(&this_00->super_QMakeEvaluator,(ProKey *)&local_88);
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_88);
  pPVar4 = (pPVar3->super_QList<ProString>).d.ptr;
  for (this_01 = pPVar4; this_01 != pPVar4 + (pPVar3->super_QList<ProString>).d.size;
      this_01 = this_01 + 1) {
    _rx = 0xaaaaaaaaaaaaaaaa;
    ProString::toQString(&local_88.m_string,this_01);
    QRegularExpression::fromWildcard(&rx,local_88.m_string.d.size,local_88.m_string.d.ptr,0,0);
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_88);
    lVar6 = (long)p_Var1[1]._M_next;
    if (lVar6 == 0) {
      p_Var5 = (_Rb_tree_node_base *)0x0;
    }
    else {
      p_Var5 = *(_Rb_tree_node_base **)(lVar6 + 0x20);
    }
    while( true ) {
      p_Var8 = (_Rb_tree_node_base *)(lVar6 + 0x10);
      if (lVar6 == 0) {
        p_Var8 = (_Rb_tree_node_base *)0x0;
      }
      if (p_Var5 == p_Var8) break;
      ProString::toQString(&local_88.m_string,(ProString *)(p_Var5 + 1));
      QRegularExpression::match(&local_c0,&rx,&local_88,0,0,0);
      cVar2 = QRegularExpressionMatch::hasMatch();
      QRegularExpressionMatch::~QRegularExpressionMatch((QRegularExpressionMatch *)&local_c0);
      QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_88);
      if (cVar2 != '\0') {
        ProStringList::join((QString *)&local_d8,(ProStringList *)&p_Var5[2]._M_left,(QChar)0x20);
        local_c0.b.d.size = local_d8.size;
        local_c0.b.d.ptr = local_d8.ptr;
        local_c0.b.d.d = local_d8.d;
        local_c0.a.a.a = (char (*) [8])0x21af19;
        local_c0.a.b = (char (*) [4])0x21c822;
        local_d8.d = (Data *)0x0;
        local_d8.ptr = (char16_t *)0x0;
        local_d8.size = 0;
        local_c0.a.a.b = (ProKey *)(p_Var5 + 1);
        ProString::
        ProString<QStringBuilder<QStringBuilder<char_const(&)[8],ProKey_const&>,char_const(&)[4]>,QString>
                  (&local_88,&local_c0);
        QList<ProString>::emplaceBack<ProString_const&>((QList<ProString> *)&local_58,&local_88);
        QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_88);
        QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_c0.b.d);
        QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_d8);
      }
      p_Var5 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var5);
      lVar6 = (long)p_Var1[1]._M_next;
    }
    QRegularExpression::~QRegularExpression(&rx);
    pPVar4 = (pPVar3->super_QList<ProString>).d.ptr;
  }
  if (local_58.size != 0) {
    QTextStream::operator<<(t,"####### Custom Variables\n");
    ProStringList::join(&local_88.m_string,(ProStringList *)&local_58,(QChar)0xa);
    pQVar7 = (QTextStream *)QTextStream::operator<<(t,(QString *)&local_88);
    pQVar7 = (QTextStream *)Qt::endl(pQVar7);
    Qt::endl(pQVar7);
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_88);
  }
  QArrayDataPointer<ProString>::~QArrayDataPointer(&local_58);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void
MakefileGenerator::writeExtraVariables(QTextStream &t)
{
    t << Qt::endl;

    ProStringList outlist;
    const ProValueMap &vars = project->variables();
    const ProStringList &exports = project->values("QMAKE_EXTRA_VARIABLES");
    for (ProStringList::ConstIterator exp_it = exports.begin(); exp_it != exports.end(); ++exp_it) {
        auto rx = QRegularExpression::fromWildcard((*exp_it).toQString(), Qt::CaseInsensitive);
        for (ProValueMap::ConstIterator it = vars.begin(); it != vars.end(); ++it) {
            if (rx.match(it.key().toQString()).hasMatch())
                outlist << ("EXPORT_" + it.key() + " = " + it.value().join(' '));
        }
    }
    if (!outlist.isEmpty()) {
        t << "####### Custom Variables\n";
        t << outlist.join('\n') << Qt::endl << Qt::endl;
    }
}